

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inter_location.cpp
# Opt level: O0

void __thiscall Am_Inter_Location::Install(Am_Inter_Location *this,Am_Object *object,bool growing)

{
  bool bVar1;
  int iVar2;
  Am_Value *pAVar3;
  int local_38;
  int local_34;
  int d;
  int c;
  int b;
  int a;
  Am_Object owner;
  bool growing_local;
  Am_Object *object_local;
  Am_Inter_Location *this_local;
  
  owner.data._7_1_ = growing;
  if (this->data != (Am_Inter_Location_Data *)0x0) {
    Am_Object::Get_Owner((Am_Object *)&b,(Am_Slot_Flags)object);
    c = (this->data->data).rect.left;
    d = (this->data->data).rect.top;
    local_34 = (this->data->data).rect.width;
    local_38 = (this->data->data).rect.height;
    bVar1 = Am_Object::Valid(&this->data->ref_obj);
    if (((bVar1) && (bVar1 = Am_Object::operator!=((Am_Object *)&b,&this->data->ref_obj), bVar1)) &&
       (Am_Translate_Coordinates(&this->data->ref_obj,c,d,(Am_Object *)&b,&c,&d),
       (this->data->as_line & 1U) != 0)) {
      Am_Translate_Coordinates
                (&this->data->ref_obj,local_34,local_38,(Am_Object *)&b,&local_34,&local_38);
    }
    if ((this->data->as_line & 1U) == 0) {
      if (this->data->a_control == Am_LOCATION_RELATIVE) {
        pAVar3 = Am_Object::Get(object,100,0);
        iVar2 = Am_Value::operator_cast_to_int(pAVar3);
        c = iVar2 + (this->data->data).rect.left;
      }
      if (this->data->b_control == Am_LOCATION_RELATIVE) {
        pAVar3 = Am_Object::Get(object,0x65,0);
        iVar2 = Am_Value::operator_cast_to_int(pAVar3);
        d = iVar2 + (this->data->data).rect.top;
      }
      if (this->data->a_control != Am_LOCATION_NOT_USED) {
        Am_Object::Set(object,100,c,0);
      }
      if (this->data->b_control != Am_LOCATION_NOT_USED) {
        Am_Object::Set(object,0x65,d,0);
      }
      if ((owner.data._7_1_ & 1) != 0) {
        if (this->data->c_control == Am_LOCATION_RELATIVE) {
          pAVar3 = Am_Object::Get(object,0x66,0);
          local_34 = Am_Value::operator_cast_to_int(pAVar3);
          local_34 = local_34 + (this->data->data).rect.width;
        }
        if (this->data->d_control == Am_LOCATION_RELATIVE) {
          pAVar3 = Am_Object::Get(object,0x67,0);
          local_38 = Am_Value::operator_cast_to_int(pAVar3);
          local_38 = local_38 + (this->data->data).rect.height;
        }
        if (this->data->c_control != Am_LOCATION_NOT_USED) {
          Am_Object::Set(object,0x66,local_34,0);
        }
        if (this->data->d_control != Am_LOCATION_NOT_USED) {
          Am_Object::Set(object,0x67,local_38,0);
        }
      }
    }
    else {
      if (this->data->a_control == Am_LOCATION_RELATIVE) {
        pAVar3 = Am_Object::Get(object,0x8b,0);
        iVar2 = Am_Value::operator_cast_to_int(pAVar3);
        c = iVar2 + (this->data->data).rect.left;
      }
      if (this->data->b_control == Am_LOCATION_RELATIVE) {
        pAVar3 = Am_Object::Get(object,0x8c,0);
        iVar2 = Am_Value::operator_cast_to_int(pAVar3);
        d = iVar2 + (this->data->data).rect.top;
      }
      if (this->data->c_control == Am_LOCATION_RELATIVE) {
        pAVar3 = Am_Object::Get(object,0x8d,0);
        local_34 = Am_Value::operator_cast_to_int(pAVar3);
        local_34 = local_34 + (this->data->data).rect.width;
      }
      if (this->data->d_control == Am_LOCATION_RELATIVE) {
        pAVar3 = Am_Object::Get(object,0x8e,0);
        local_38 = Am_Value::operator_cast_to_int(pAVar3);
        local_38 = local_38 + (this->data->data).rect.height;
      }
      if (this->data->a_control != Am_LOCATION_NOT_USED) {
        Am_Object::Set(object,0x8b,c,0);
      }
      if (this->data->b_control != Am_LOCATION_NOT_USED) {
        Am_Object::Set(object,0x8c,d,0);
      }
      if (this->data->c_control != Am_LOCATION_NOT_USED) {
        Am_Object::Set(object,0x8d,local_34,0);
      }
      if (this->data->d_control != Am_LOCATION_NOT_USED) {
        Am_Object::Set(object,0x8e,local_38,0);
      }
    }
    Am_Object::~Am_Object((Am_Object *)&b);
    return;
  }
  Am_Error("Am_Inter_Location not initialized");
}

Assistant:

void
Am_Inter_Location::Install(Am_Object &object, bool growing) const
{
  if (!data)
    Am_Error("Am_Inter_Location not initialized");
  Am_Object owner = object.Get_Owner();
  int a = data->data.line.x1;
  int b = data->data.line.y1;
  int c = data->data.line.x2;
  int d = data->data.line.y2;

  if (data->ref_obj.Valid() && owner != data->ref_obj) {
    Am_INTER_TRACE_PRINT(Am_INTER_TRACE_SETTING,
                         "Translating set coordinates from "
                             << data->ref_obj << " to " << owner);
    Am_Translate_Coordinates(data->ref_obj, a, b, owner, a, b);
    if (data->as_line)
      Am_Translate_Coordinates(data->ref_obj, c, d, owner, c, d);
  }
  Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING,
                              "++Object setting obj position=" << object);
  if (data->as_line) {
    if (data->a_control == Am_LOCATION_RELATIVE)
      a = (int)object.Get(Am_X1) + data->data.line.x1;
    if (data->b_control == Am_LOCATION_RELATIVE)
      b = (int)object.Get(Am_Y1) + data->data.line.y1;
    if (data->c_control == Am_LOCATION_RELATIVE)
      c = (int)object.Get(Am_X2) + data->data.line.x2;
    if (data->d_control == Am_LOCATION_RELATIVE)
      d = (int)object.Get(Am_Y2) + data->data.line.y2;

    if (data->a_control != Am_LOCATION_NOT_USED) {
      Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " X1=" << a);
      object.Set(Am_X1, a); // , Am_NO_ANIMATION
    }
    if (data->b_control != Am_LOCATION_NOT_USED) {
      Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " Y1=" << b);
      object.Set(Am_Y1, b); // , Am_NO_ANIMATION
    }
    if (data->c_control != Am_LOCATION_NOT_USED) {
      Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " X2=" << c);
      object.Set(Am_X2, c); // , Am_NO_ANIMATION
    }
    if (data->d_control != Am_LOCATION_NOT_USED) {
      Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " Y2=" << d);
      object.Set(Am_Y2, d); // , Am_NO_ANIMATION
    }
  } else {
    if (data->a_control == Am_LOCATION_RELATIVE)
      a = (int)object.Get(Am_LEFT) + data->data.rect.left;
    if (data->b_control == Am_LOCATION_RELATIVE)
      b = (int)object.Get(Am_TOP) + data->data.rect.top;

    if (data->a_control != Am_LOCATION_NOT_USED) {
      Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " left=" << a);
      object.Set(Am_LEFT, a); // , Am_NO_ANIMATION
    }
    if (data->b_control != Am_LOCATION_NOT_USED) {
      Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " top=" << b);
      object.Set(Am_TOP, b); // , Am_NO_ANIMATION
    }
    if (growing) {
      if (data->c_control == Am_LOCATION_RELATIVE)
        c = (int)object.Get(Am_WIDTH) + data->data.rect.width;
      if (data->d_control == Am_LOCATION_RELATIVE)
        d = (int)object.Get(Am_HEIGHT) + data->data.rect.height;

      if (data->c_control != Am_LOCATION_NOT_USED) {
        Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " width=" << c);
        object.Set(Am_WIDTH, c); // , Am_NO_ANIMATION
      }
      if (data->d_control != Am_LOCATION_NOT_USED) {
        Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, " height=" << d);
        object.Set(Am_HEIGHT, d); // , Am_NO_ANIMATION
      }
    }
  }
  Am_INTER_TRACE_PRINT_NOENDL(Am_INTER_TRACE_SETTING, std::endl << std::flush);
}